

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

bool cmsys::SystemTools::FindProgramPath
               (char *argv0,string *pathOut,string *errorMsg,char *exeName,char *buildDir,
               char *installPrefix)

{
  size_type sVar1;
  pointer pbVar2;
  bool bVar3;
  size_t sVar4;
  ostream *poVar5;
  string *ff;
  char *pcVar6;
  pointer pbVar7;
  string self;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  failures;
  string intdir;
  value_type local_218;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  char *local_1e0;
  string *local_1d8;
  string *local_1d0;
  undefined1 local_1c8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar6 = "";
  if (argv0 != (char *)0x0) {
    pcVar6 = argv0;
  }
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  local_1e0 = installPrefix;
  local_1d0 = errorMsg;
  sVar4 = strlen(pcVar6);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,pcVar6,pcVar6 + sVar4);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1f8,&local_218);
  ConvertToUnixSlashes(&local_218);
  local_1c8._0_8_ = (pointer)0x0;
  local_1c8._8_8_ = (pointer)0x0;
  local_1c8._16_8_ = (pointer)0x0;
  FindProgram((string *)&local_1a8,&local_218,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1c8,false);
  std::__cxx11::string::operator=((string *)&local_218,(string *)local_1a8._M_local_buf);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_allocated_capacity != local_198) {
    operator_delete((void *)local_1a8._M_allocated_capacity,local_198[0]._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1c8);
  bVar3 = FileIsExecutable(&local_218);
  if (buildDir != (char *)0x0 && !bVar3) {
    local_1d8 = pathOut;
    local_1a8._M_allocated_capacity = (size_type)local_198;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,".","");
    sVar1 = local_218._M_string_length;
    strlen(buildDir);
    std::__cxx11::string::_M_replace((ulong)&local_218,0,(char *)sVar1,(ulong)buildDir);
    std::__cxx11::string::append((char *)&local_218);
    std::__cxx11::string::_M_append((char *)&local_218,local_1a8._M_allocated_capacity);
    std::__cxx11::string::append((char *)&local_218);
    std::__cxx11::string::append((char *)&local_218);
    std::__cxx11::string::append((char *)&local_218);
    pathOut = local_1d8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_allocated_capacity != local_198) {
      operator_delete((void *)local_1a8._M_allocated_capacity,local_198[0]._M_allocated_capacity + 1
                     );
    }
  }
  if (local_1e0 != (char *)0x0) {
    bVar3 = FileIsExecutable(&local_218);
    if (!bVar3) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_1f8,&local_218);
      pcVar6 = local_1e0;
      strlen(local_1e0);
      std::__cxx11::string::_M_replace
                ((ulong)&local_218,0,(char *)local_218._M_string_length,(ulong)pcVar6);
      std::__cxx11::string::append((char *)&local_218);
      std::__cxx11::string::append((char *)&local_218);
    }
  }
  bVar3 = FileIsExecutable(&local_218);
  if (bVar3) {
    std::__cxx11::string::_M_assign((string *)pathOut);
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_1f8,&local_218);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8._M_local_buf);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Can not find the command line program ",0x26);
    if (exeName != (char *)0x0) {
      sVar4 = strlen(exeName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,exeName,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
    if (argv0 != (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"  argv[0] = \"",0xd)
      ;
      sVar4 = strlen(argv0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,argv0,sVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\"\n",2);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"  Attempted paths:\n",0x13);
    pbVar2 = local_1f8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_1f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar7 = local_1f8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"    \"",5);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1a8,(pbVar7->_M_dataplus)._M_p,
                            pbVar7->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"\n",2);
        pbVar7 = pbVar7 + 1;
      } while (pbVar7 != pbVar2);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)local_1d0,(string *)local_1c8);
    if ((pointer)local_1c8._0_8_ != (pointer)(local_1c8 + 0x10)) {
      operator_delete((void *)local_1c8._0_8_,
                      (ulong)((long)&((_Alloc_hider *)local_1c8._16_8_)->_M_p + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8._M_local_buf);
    std::ios_base::~ios_base(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1f8);
  return bVar3;
}

Assistant:

bool SystemTools::FindProgramPath(const char* argv0, std::string& pathOut,
                                  std::string& errorMsg, const char* exeName,
                                  const char* buildDir,
                                  const char* installPrefix)
{
  std::vector<std::string> failures;
  std::string self = argv0 ? argv0 : "";
  failures.push_back(self);
  SystemTools::ConvertToUnixSlashes(self);
  self = SystemTools::FindProgram(self);
  if (!SystemTools::FileIsExecutable(self)) {
    if (buildDir) {
      std::string intdir = ".";
#ifdef CMAKE_INTDIR
      intdir = CMAKE_INTDIR;
#endif
      self = buildDir;
      self += "/bin/";
      self += intdir;
      self += "/";
      self += exeName;
      self += SystemTools::GetExecutableExtension();
    }
  }
  if (installPrefix) {
    if (!SystemTools::FileIsExecutable(self)) {
      failures.push_back(self);
      self = installPrefix;
      self += "/bin/";
      self += exeName;
    }
  }
  if (!SystemTools::FileIsExecutable(self)) {
    failures.push_back(self);
    std::ostringstream msg;
    msg << "Can not find the command line program ";
    if (exeName) {
      msg << exeName;
    }
    msg << "\n";
    if (argv0) {
      msg << "  argv[0] = \"" << argv0 << "\"\n";
    }
    msg << "  Attempted paths:\n";
    for (std::string const& ff : failures) {
      msg << "    \"" << ff << "\"\n";
    }
    errorMsg = msg.str();
    return false;
  }
  pathOut = self;
  return true;
}